

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.cc
# Opt level: O0

Optional<webrtc::CartesianPoint<float>_>
webrtc::GetArrayNormalIfExists
          (vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
           *array_geometry)

{
  bool bVar1;
  CartesianPoint<float> *pCVar2;
  float fVar3;
  float fVar4;
  Optional<webrtc::CartesianPoint<float>_> OVar5;
  vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_> *local_70;
  float local_68;
  bool bStack_64;
  undefined1 local_5c [8];
  Optional<webrtc::CartesianPoint<float>_> normal;
  float local_40 [2];
  float local_38;
  bool bStack_34;
  undefined1 local_30 [8];
  Optional<webrtc::CartesianPoint<float>_> direction;
  vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
  *array_geometry_local;
  undefined8 local_10;
  
  direction._8_8_ = array_geometry;
  OVar5 = GetDirectionIfLinear(array_geometry);
  local_40 = OVar5.value_.c._0_8_;
  local_30._0_4_ = local_40[0];
  local_30._4_4_ = local_40[1];
  local_38 = OVar5.value_.c[2];
  direction.value_.c[0] = local_38;
  bStack_34 = OVar5.has_value_;
  direction.value_.c[1]._0_1_ = bStack_34;
  bVar1 = rtc::Optional::operator_cast_to_bool((Optional *)local_30);
  if (bVar1) {
    pCVar2 = rtc::Optional<webrtc::CartesianPoint<float>_>::operator->
                       ((Optional<webrtc::CartesianPoint<float>_> *)local_30);
    fVar4 = CartesianPoint<float>::y(pCVar2);
    pCVar2 = rtc::Optional<webrtc::CartesianPoint<float>_>::operator->
                       ((Optional<webrtc::CartesianPoint<float>_> *)local_30);
    fVar3 = CartesianPoint<float>::x(pCVar2);
    CartesianPoint<float>::CartesianPoint
              ((CartesianPoint<float> *)(normal.value_.c + 2),fVar4,-fVar3,0.0);
    rtc::Optional<webrtc::CartesianPoint<float>_>::Optional
              ((Optional<webrtc::CartesianPoint<float>_> *)&array_geometry_local,
               (CartesianPoint<float> *)(normal.value_.c + 2));
  }
  else {
    OVar5 = GetNormalIfPlanar((vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
                               *)direction._8_8_);
    local_70 = OVar5.value_.c._0_8_;
    local_5c = (undefined1  [8])local_70;
    local_68 = OVar5.value_.c[2];
    normal.value_.c[0] = local_68;
    bStack_64 = OVar5.has_value_;
    normal.value_.c[1] = (float)CONCAT31(normal.value_.c[1]._1_3_,bStack_64);
    bVar1 = rtc::Optional::operator_cast_to_bool((Optional *)local_5c);
    if (bVar1) {
      pCVar2 = rtc::Optional<webrtc::CartesianPoint<float>_>::operator->
                         ((Optional<webrtc::CartesianPoint<float>_> *)local_5c);
      fVar4 = CartesianPoint<float>::z(pCVar2);
      if (fVar4 < 1e-06) {
        array_geometry_local =
             (vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
              *)local_5c;
        local_10._4_4_ = normal.value_.c[1];
        local_10._0_4_ = normal.value_.c[0];
        goto LAB_0023abd9;
      }
    }
    rtc::Optional<webrtc::CartesianPoint<float>_>::Optional
              ((Optional<webrtc::CartesianPoint<float>_> *)&array_geometry_local);
  }
LAB_0023abd9:
  OVar5.value_.c[2] = (float)local_10;
  OVar5.has_value_ = local_10._4_1_;
  OVar5._13_3_ = local_10._5_3_;
  OVar5.value_.c._0_8_ = array_geometry_local;
  return OVar5;
}

Assistant:

rtc::Optional<Point> GetArrayNormalIfExists(
    const std::vector<Point>& array_geometry) {
  const rtc::Optional<Point> direction = GetDirectionIfLinear(array_geometry);
  if (direction) {
    return rtc::Optional<Point>(Point(direction->y(), -direction->x(), 0.f));
  }
  const rtc::Optional<Point> normal = GetNormalIfPlanar(array_geometry);
  if (normal && normal->z() < kMaxDotProduct) {
    return normal;
  }
  return rtc::Optional<Point>();
}